

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

void asmjit::v1_14::EmitterUtils::logLabelBound(BaseAssembler *self,Label *label)

{
  long *plVar1;
  long in_RDI;
  size_t binSize;
  StringTmp<512UL> sb;
  Logger *logger;
  FormatIndentationGroup *in_stack_fffffffffffffc98;
  StringTmp<512UL> *this;
  undefined4 in_stack_fffffffffffffca0;
  char c;
  ModifyOp in_stack_fffffffffffffca4;
  String *in_stack_fffffffffffffca8;
  undefined8 in_stack_fffffffffffffcb0;
  String *in_stack_fffffffffffffcb8;
  ulong in_stack_fffffffffffffce8;
  ulong in_stack_fffffffffffffcf0;
  size_t in_stack_fffffffffffffcf8;
  uint8_t *in_stack_fffffffffffffd00;
  FormatOptions *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  uint32_t in_stack_fffffffffffffd14;
  BaseEmitter *in_stack_fffffffffffffd18;
  FormatFlags in_stack_fffffffffffffd24;
  String *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffde0;
  
  plVar1 = *(long **)(in_RDI + 0x38);
  memset((StringTmp<512UL> *)&stack0xfffffffffffffce8,0,0x20);
  StringTmp<512UL>::_resetToTemporary((StringTmp<512UL> *)&stack0xfffffffffffffce8);
  Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>
            (*(FormatFlags *)(plVar1 + 1),kMachineCode);
  Support::Array<unsigned_char,_4UL>::operator[]<asmjit::v1_14::FormatIndentationGroup>
            ((Array<unsigned_char,_4UL> *)
             CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),in_stack_fffffffffffffc98
            );
  c = (char)((uint)in_stack_fffffffffffffca0 >> 0x18);
  String::_opChars(in_stack_fffffffffffffcb8,(ModifyOp)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                   (char)((ulong)in_stack_fffffffffffffcb0 >> 0x18),
                   (size_t)in_stack_fffffffffffffca8);
  Formatter::formatLabel
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd14);
  String::_opChar(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,c);
  this = *(StringTmp<512UL> **)(in_RDI + 0x60);
  finishFormattedLine((String *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                      in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
                      in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffde0)
  ;
  if ((byte)SUB81(in_stack_fffffffffffffce8,0) < 0x1f) {
    in_stack_fffffffffffffd00 = &stack0xfffffffffffffce9;
    in_stack_fffffffffffffcf0 = in_stack_fffffffffffffce8 & 0xff;
  }
  (**(code **)(*plVar1 + 0x10))(plVar1,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf0);
  StringTmp<512UL>::~StringTmp(this);
  return;
}

Assistant:

void logLabelBound(BaseAssembler* self, const Label& label) noexcept {
  Logger* logger = self->logger();

  StringTmp<512> sb;
  size_t binSize = logger->hasFlag(FormatFlags::kMachineCode) ? size_t(0) : SIZE_MAX;

  sb.appendChars(' ', logger->indentation(FormatIndentationGroup::kLabel));
  Formatter::formatLabel(sb, logger->flags(), self, label.id());
  sb.append(':');
  finishFormattedLine(sb, logger->options(), nullptr, binSize, 0, 0, self->_inlineComment);
  logger->log(sb.data(), sb.size());
}